

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_dump.h
# Opt level: O1

void dumpTokenArray(KonohaContext *kctx,int nest,kArray *a,int s,int e)

{
  kToken *tk;
  _func_int_char_ptr_varargs *p_Var1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  
  if (verbose_sugar != 0) {
    if (nest == 0) {
      (*kctx->platApi->printf_i)(">>>\n");
    }
    if (s < e) {
      lVar4 = (long)s;
      do {
        tk = (kToken *)(a->field_2).unboxItems[lVar4];
        iVar3 = nest;
        if (0 < nest) {
          do {
            (*kctx->platApi->printf_i)("  ");
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
        }
        dumpToken(kctx,tk,(int)lVar4);
        if (((((tk->field_2).text)->h).ct)->baseTypeId == 6) {
          iVar3 = nest;
          if (0 < nest) {
            do {
              (*kctx->platApi->printf_i)("  ");
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
          }
          p_Var1 = kctx->platApi->printf_i;
          uVar2 = (**(code **)(*(long *)(*(long *)(*(long *)(((tk->field_2).text)->field_2).byteptr
                                                  + 0x20) + 8) + 0x20))(kctx);
          (*p_Var1)("%s\n",uVar2);
          dumpTokenArray(kctx,nest + 1,(tk->field_2).GroupTokenList,1,
                         (int)(((tk->field_2).GroupTokenList)->bytesize >> 3) + -1);
          iVar3 = nest;
          if (0 < nest) {
            do {
              (*kctx->platApi->printf_i)("  ");
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
          }
          p_Var1 = kctx->platApi->printf_i;
          uVar2 = (**(code **)(*(long *)(*(long *)(*(long *)((((tk->field_2).text)->field_2).byteptr
                                                            + ((((tk->field_2).text)->bytesize &
                                                               0xfffffffffffffff8) - 8)) + 0x20) + 8
                                        ) + 0x20))(kctx);
          (*p_Var1)("%s\n",uVar2);
        }
        lVar4 = lVar4 + 1;
      } while ((int)lVar4 != e);
    }
    if (nest == 0) {
      (*kctx->platApi->printf_i)("<<<\n");
      return;
    }
  }
  return;
}

Assistant:

static void dumpTokenArray(KonohaContext *kctx, int nest, kArray *a, int s, int e)
{
	if(verbose_sugar) {
		if(nest == 0) DUMP_P(">>>\n");
		while(s < e) {
			kToken *tk = a->TokenItems[s];
			dumpIndent(kctx, nest);
			dumpToken(kctx, tk, s);
			if(IS_Array(tk->GroupTokenList)) {
				dumpIndent(kctx, nest);
				DUMP_P("%s\n", kString_text(tk->GroupTokenList->TokenItems[0]->text));
				dumpTokenArray(kctx, nest+1, RangeGroup(tk->GroupTokenList));
				dumpIndent(kctx, nest);
				DUMP_P("%s\n", kString_text(tk->GroupTokenList->TokenItems[kArray_size(tk->GroupTokenList)-1]->text));
			}
			s++;
		}
		if(nest == 0) DUMP_P("<<<\n");
	}
}